

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall DLightFlash::DLightFlash(DLightFlash *this,sector_t *sector)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f3428;
  sVar1 = sector->lightlevel;
  this->m_MaxLight = (int)sVar1;
  iVar2 = sector_t::FindMinSurroundingLight(sector,(int)sVar1);
  this->m_MinLight = iVar2;
  this->m_MaxTime = 0x40;
  this->m_MinTime = 7;
  uVar3 = FRandom::operator()(&pr_lightflash);
  this->m_Count = (uVar3 & this->m_MaxTime) + 1;
  return;
}

Assistant:

DLightFlash::DLightFlash (sector_t *sector)
	: DLighting (sector)
{
	// Find light levels like Doom.
	m_MaxLight = sector->lightlevel;
	m_MinLight = sector->FindMinSurroundingLight (sector->lightlevel);
	m_MaxTime = 64;
	m_MinTime = 7;
	m_Count = (pr_lightflash() & m_MaxTime) + 1;
}